

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void cscPrintDense(char *s,CUPDLPcsc *csc)

{
  long in_RSI;
  undefined8 in_RDI;
  cupdlp_int i;
  cupdlp_int iElem;
  cupdlp_int iCol;
  cupdlp_int deltaRow;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  printf("------------------------------------------------\n");
  printf("%s (Trans):\n",in_RDI);
  for (local_18 = 0; local_18 < *(int *)(in_RSI + 4); local_18 = local_18 + 1) {
    local_1c = *(int *)(*(long *)(in_RSI + 0x10) + (long)local_18 * 4);
    while( true ) {
      if (*(int *)(*(long *)(in_RSI + 0x10) + (long)(local_18 + 1) * 4) <= local_1c) break;
      if (local_1c == *(int *)(*(long *)(in_RSI + 0x10) + (long)local_18 * 4)) {
        local_14 = *(int *)(*(long *)(in_RSI + 0x18) + (long)local_1c * 4);
      }
      else {
        local_14 = (*(int *)(*(long *)(in_RSI + 0x18) + (long)local_1c * 4) -
                   *(int *)(*(long *)(in_RSI + 0x18) + (long)(local_1c + -1) * 4)) + -1;
      }
      for (local_20 = 0; local_20 < local_14; local_20 = local_20 + 1) {
        printf("       ");
      }
      printf("%6.3f ",*(undefined8 *)(*(long *)(in_RSI + 0x20) + (long)local_1c * 8));
      local_1c = local_1c + 1;
    }
    printf("\n");
  }
  printf("------------------------------------------------\n");
  return;
}

Assistant:

void cscPrintDense(const char *s, CUPDLPcsc *csc) {
  cupdlp_printf("------------------------------------------------\n");
  cupdlp_printf("%s (Trans):\n", s);
  cupdlp_int deltaRow = 0;
  for (cupdlp_int iCol = 0; iCol < csc->nCols; ++iCol) {
    for (cupdlp_int iElem = csc->colMatBeg[iCol];
         iElem < csc->colMatBeg[iCol + 1]; ++iElem) {
      if (iElem == csc->colMatBeg[iCol])
        deltaRow = csc->colMatIdx[iElem];
      else
        deltaRow = csc->colMatIdx[iElem] - csc->colMatIdx[iElem - 1] - 1;
      for (cupdlp_int i = 0; i < deltaRow; ++i) {
        cupdlp_printf("       ");
      }
      cupdlp_printf("%6.3f ", csc->colMatElem[iElem]);
    }
    cupdlp_printf("\n");
  }
  cupdlp_printf("------------------------------------------------\n");
}